

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libwebsockets.c
# Opt level: O1

void lws_strexp_init(lws_strexp_t *exp,void *priv,lws_strexp_expand_cb cb,char *out,size_t olen)

{
  exp->cb = (lws_strexp_expand_cb)0x0;
  exp->priv = (void *)0x0;
  exp->out = (char *)0x0;
  exp->olen = 0;
  exp->pos = 0;
  exp->exp_ofs = 0;
  exp->name[0x10] = '\0';
  exp->name[0x11] = '\0';
  exp->name[0x12] = '\0';
  exp->name[0x13] = '\0';
  exp->name[0x14] = '\0';
  exp->name[0x15] = '\0';
  exp->name[0x16] = '\0';
  exp->name[0x17] = '\0';
  exp->name[0x18] = '\0';
  exp->name[0x19] = '\0';
  exp->name[0x1a] = '\0';
  exp->name[0x1b] = '\0';
  exp->name[0x1c] = '\0';
  exp->name[0x1d] = '\0';
  exp->name[0x1e] = '\0';
  exp->name[0x1f] = '\0';
  exp->name[0] = '\0';
  exp->name[1] = '\0';
  exp->name[2] = '\0';
  exp->name[3] = '\0';
  exp->name[4] = '\0';
  exp->name[5] = '\0';
  exp->name[6] = '\0';
  exp->name[7] = '\0';
  exp->name[8] = '\0';
  exp->name[9] = '\0';
  exp->name[10] = '\0';
  exp->name[0xb] = '\0';
  exp->name[0xc] = '\0';
  exp->name[0xd] = '\0';
  exp->name[0xe] = '\0';
  exp->name[0xf] = '\0';
  exp->name_pos = '\0';
  exp->state = '\0';
  *(undefined6 *)&exp->field_0x52 = 0;
  exp->cb = cb;
  exp->out = out;
  exp->olen = olen;
  exp->state = '\0';
  exp->priv = priv;
  return;
}

Assistant:

void
lws_strexp_init(lws_strexp_t *exp, void *priv, lws_strexp_expand_cb cb,
		 char *out, size_t olen)
{
	memset(exp, 0, sizeof(*exp));
	exp->cb = cb;
	exp->out = out;
	exp->olen = olen;
	exp->state = LWS_EXPS_LITERAL;
	exp->priv = priv;
}